

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O3

void test_common<short>(uint length,short value)

{
  ulong uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  void *pvVar3;
  ulong uVar4;
  undefined8 *puVar5;
  long lVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  shared_ptr<short> pa;
  shared_ptr<short> pb;
  
  uVar1 = (ulong)length;
  uVar4 = 0xffffffffffffffff;
  if (-1 < (int)(length + 1)) {
    uVar4 = (ulong)(length + 1) * 2;
  }
  pvVar3 = operator_new__(uVar4);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<short*,void(*)(short*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pa,pvVar3,nosimd::common::free<short>);
  pa.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar4);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<short*,void(*)(short*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pb,
             pa.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<short>);
  _Var2._M_pi = pa.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  *(undefined2 *)((long)pvVar3 + uVar1 * 2) = 0x7f;
  *(undefined2 *)
   ((long)&(pa.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + uVar1 * 2) = 0x3f;
  if (0 < (int)length) {
    uVar4 = 0;
    do {
      *(short *)((long)pvVar3 + uVar4 * 2) = value;
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  if (length != 0) {
    uVar4 = 0;
    do {
      if (*(short *)((long)pvVar3 + uVar4 * 2) != value) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar5 = "void test_common(unsigned int, T) [T = short]";
        *(undefined4 *)(puVar5 + 1) = 0x16;
        *(uint *)((long)puVar5 + 0xc) = length;
        __cxa_throw(puVar5,&Exception::typeinfo,0);
      }
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
    if (0 < (int)length) {
      uVar4 = 0;
      do {
        *(undefined2 *)
         ((long)&(pa.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                 _vptr__Sp_counted_base + uVar4 * 2) = *(undefined2 *)((long)pvVar3 + uVar4 * 2);
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
    if (length != 0) {
      uVar4 = 0;
      do {
        if (*(short *)((long)&(pa.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi)->_vptr__Sp_counted_base + uVar4 * 2) != value) {
          puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
          *puVar5 = "void test_common(unsigned int, T) [T = short]";
          *(undefined4 *)(puVar5 + 1) = 0x1d;
          *(uint *)((long)puVar5 + 0xc) = length;
          __cxa_throw(puVar5,&Exception::typeinfo,0);
        }
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
      if ((int)length < 1) {
        if (length == 0) goto LAB_00105ef1;
      }
      else {
        memset(pa.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,0,
               (ulong)(length * 2));
      }
      uVar4 = 0;
      do {
        if (*(short *)((long)&(_Var2._M_pi)->_vptr__Sp_counted_base + uVar4 * 2) != 0) {
          puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
          *puVar5 = "void test_common(unsigned int, T) [T = short]";
          *(undefined4 *)(puVar5 + 1) = 0x24;
          *(uint *)((long)puVar5 + 0xc) = length;
          __cxa_throw(puVar5,&Exception::typeinfo,0);
        }
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
      if (length != 0) {
        uVar4 = 0;
        do {
          *(short *)((long)pvVar3 + uVar4 * 2) = (short)uVar4;
          uVar4 = uVar4 + 1;
        } while (uVar1 != uVar4);
        if (0 < (int)length) {
          uVar4 = 0;
          do {
            *(undefined2 *)((long)&(_Var2._M_pi)->_vptr__Sp_counted_base + uVar4 * 2) =
                 *(undefined2 *)((long)pvVar3 + uVar4 * 2);
            uVar4 = uVar4 + 1;
          } while (uVar1 != uVar4);
        }
        if (length != 0) {
          lVar6 = 0;
          _Var7._M_pi = _Var2._M_pi;
          do {
            if ((int)lVar6 >> 0x10 != (int)*(short *)&(_Var7._M_pi)->_vptr__Sp_counted_base) {
              puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
              *puVar5 = "void test_common(unsigned int, T) [T = short]";
              *(undefined4 *)(puVar5 + 1) = 0x2d;
              *(uint *)((long)puVar5 + 0xc) = length;
              __cxa_throw(puVar5,&Exception::typeinfo,0);
            }
            _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          ((long)&(_Var7._M_pi)->_vptr__Sp_counted_base + 2);
            lVar6 = lVar6 + 0x10000;
          } while (uVar1 << 0x10 != lVar6);
        }
      }
    }
  }
LAB_00105ef1:
  if ((*(short *)((long)pvVar3 + uVar1 * 2) == 0x7f) &&
     (*(short *)((long)&(_Var2._M_pi)->_vptr__Sp_counted_base + uVar1 * 2) == 0x3f)) {
    if (pb.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pb.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (pa.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pa.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    return;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar5 = "void test_common(unsigned int, T) [T = short]";
  *(undefined4 *)(puVar5 + 1) = 0x31;
  *(uint *)((long)puVar5 + 0xc) = length;
  __cxa_throw(puVar5,&Exception::typeinfo,0);
}

Assistant:

void test_common(unsigned length, T value = 42)
{
    std::shared_ptr<T> pa = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    std::shared_ptr<T> pb = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * a = pa.get();
    T * b = pb.get();
    a[length] = 0x7f;
    b[length] = 0x3f;

    simd::set(value, a, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (a[i] != value)
            FAIL();
    }

    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != value)
            FAIL();
    }

    simd::zero(b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != 0)
            FAIL();
    }

    for (unsigned i=0; i<length; ++i)
        a[i] = i;
    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != (T)i)
            FAIL();
    }

    if (a[length] != 0x7f || b[length] != 0x3f)
        FAIL();
}